

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall
QTabBarPrivate::calculateFirstLastVisible(QTabBarPrivate *this,int index,bool visible,bool remove)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  long lVar5;
  ulong uVar6;
  ulong uVar4;
  
  iVar2 = this->firstVisible;
  if ((int)CONCAT71(in_register_00000011,visible) != 0) {
    if (index <= iVar2) {
      iVar2 = index;
    }
    this->firstVisible = iVar2;
    if (index < this->lastVisible) {
      index = this->lastVisible;
    }
    this->lastVisible = index;
    return;
  }
  if (iVar2 == index || remove) {
    this->firstVisible = -1;
    lVar1 = (this->tabList).d.size;
    if (lVar1 != 0) {
      lVar5 = 0;
      do {
        if (((this->tabList).d.ptr[lVar5]->field_0xe4 & 2) != 0) {
          this->firstVisible = (int)lVar5;
          break;
        }
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
  }
  if ((remove) || (this->lastVisible == index)) {
    this->lastVisible = -1;
    uVar4 = (this->tabList).d.size;
    uVar6 = uVar4 & 0xffffffff;
    while( true ) {
      uVar6 = uVar6 - 1;
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 < 0) break;
      if (((this->tabList).d.ptr[(uint)uVar6 & 0x7fffffff]->field_0xe4 & 2) != 0) {
        this->lastVisible = uVar3;
        return;
      }
    }
  }
  return;
}

Assistant:

void QTabBarPrivate::calculateFirstLastVisible(int index, bool visible, bool remove)
{
    if (visible) {
        firstVisible = qMin(index, firstVisible);
        lastVisible  = qMax(index, lastVisible);
    } else {
        if (remove || (index == firstVisible)) {
            firstVisible = -1;
            for (int i = 0; i < tabList.size(); ++i) {
                if (tabList.at(i)->visible) {
                    firstVisible = i;
                    break;
                }
            }
        }
        if (remove || (index == lastVisible)) {
            lastVisible = -1;
            for (int i = tabList.size() - 1; i >= 0; --i) {
                if (tabList.at(i)->visible) {
                    lastVisible = i;
                    break;
                }
            }
        }
    }
}